

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall
fragment_buffer_variant::fragment_buffer_variant
          (fragment_buffer_variant *this,string *_raw_text,int64_t _offset,int64_t _length)

{
  char *pcVar1;
  undefined8 uVar2;
  
  this->type = FRAGMENT_BUFFER_VARIANT_TYPE_RAW_TEXT;
  this->token = -1;
  (this->_dummy)._M_dataplus._M_p = (pointer)&(this->_dummy).field_2;
  (this->_dummy)._M_string_length = 0;
  (this->_dummy).field_2._M_local_buf[0] = '\0';
  this->raw_text = _raw_text;
  this->offset = _offset;
  this->length = _length;
  if (_offset < 0) {
    pcVar1 = "_offset >= 0";
    uVar2 = 0x4be;
  }
  else if (_length < 1) {
    pcVar1 = "_length >= 1";
    uVar2 = 0x4bf;
  }
  else {
    if ((ulong)(_length + _offset) <= _raw_text->_M_string_length) {
      return;
    }
    pcVar1 = "offset + length <= raw_text.length()";
    uVar2 = 0x4c0;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
             ,uVar2,"GGML_ASSERT(%s) failed",pcVar1);
}

Assistant:

fragment_buffer_variant(const std::string & _raw_text, int64_t _offset, int64_t _length)
    :
        type(FRAGMENT_BUFFER_VARIANT_TYPE_RAW_TEXT),
        token((llama_token) - 1),
        raw_text(_raw_text),
        offset(_offset),
        length(_length){
            GGML_ASSERT(_offset >= 0);
            GGML_ASSERT(_length >= 1);
            GGML_ASSERT(offset + length <= raw_text.length());
        }